

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

void __thiscall CVmObjStringBuffer::save_to_file(CVmObjStringBuffer *this,CVmFile *fp)

{
  uint v;
  vm_strbuf_ext *pvVar1;
  CVmObjStringBuffer *in_RDI;
  int i;
  wchar_t *src;
  vm_strbuf_ext *ext;
  uint in_stack_ffffffffffffffdc;
  CVmFile *in_stack_ffffffffffffffe0;
  CVmFile *this_00;
  
  pvVar1 = get_ext(in_RDI);
  CVmFile::write_uint4(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  CVmFile::write_uint4(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  CVmFile::write_uint4(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  this_00 = (CVmFile *)pvVar1->buf;
  for (v = pvVar1->len; v != 0; v = v - 1) {
    this_00 = (CVmFile *)((long)&this_00->fp_ + 4);
    CVmFile::write_uint2(this_00,v);
  }
  return;
}

Assistant:

void CVmObjStringBuffer::save_to_file(VMG_ class CVmFile *fp)
{
    vm_strbuf_ext *ext = get_ext();

    /* write our allocation and string length data */
    fp->write_uint4(ext->alo);
    fp->write_uint4(ext->inc);
    fp->write_uint4(ext->len);

    /* write the string contents */
    const wchar_t *src;
    int i;
    for (i = ext->len, src = ext->buf ; i != 0 ; --i)
        fp->write_uint2(*src++);
}